

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void fwrite_pet(CHAR_DATA *pet,FILE *fp)

{
  RACE_DATA *pRVar1;
  char *pcVar2;
  FILE *in_RSI;
  long in_RDI;
  long *in_stack_ffffffffffffffd0;
  FILE *__stream;
  
  fprintf(in_RSI,"#PET\n");
  fprintf(in_RSI,"Vnum %d\n",(ulong)(uint)(int)*(short *)(*(long *)(in_RDI + 0x78) + 0x48));
  fprintf(in_RSI,"Name %s~\n",*(undefined8 *)(in_RDI + 0xe8));
  fprintf(in_RSI,"LogO %ld\n",current_time);
  if (*(long *)(in_RDI + 0x108) != *(long *)(*(long *)(in_RDI + 0x78) + 0x60)) {
    fprintf(in_RSI,"ShD  %s~\n",*(undefined8 *)(in_RDI + 0x108));
  }
  if (*(long *)(in_RDI + 0x110) != *(long *)(*(long *)(in_RDI + 0x78) + 0x68)) {
    fprintf(in_RSI,"LnD  %s~\n",*(undefined8 *)(in_RDI + 0x110));
  }
  if (*(long *)(in_RDI + 0x118) != *(long *)(*(long *)(in_RDI + 0x78) + 0x70)) {
    fprintf(in_RSI,"Desc %s~\n",*(undefined8 *)(in_RDI + 0x118));
  }
  if (*(short *)(in_RDI + 0x136) != *(short *)(*(long *)(in_RDI + 0x78) + 0x11c)) {
    pRVar1 = race_data_lookup((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    fprintf(in_RSI,"Race %s~\n",pRVar1->name);
  }
  if (*(short *)(in_RDI + 0x132) != 0) {
    fprintf(in_RSI,"Cabal %s~\n",cabal_table[*(short *)(in_RDI + 0x132)].name);
  }
  fprintf(in_RSI,"Sex  %d\n",(ulong)(uint)(int)*(short *)(in_RDI + 0x134));
  if (*(short *)(in_RDI + 0x138) != *(short *)(*(long *)(in_RDI + 0x78) + 0x9a)) {
    fprintf(in_RSI,"Levl %d\n",(ulong)(uint)(int)*(short *)(in_RDI + 0x138));
  }
  fprintf(in_RSI,"HMV  %d %d %d %d %d %d\n",(ulong)*(uint *)(in_RDI + 0x158),
          (ulong)(uint)(int)*(short *)(in_RDI + 0x15c),(ulong)(uint)(int)*(short *)(in_RDI + 0x15e),
          (ulong)(uint)(int)*(short *)(in_RDI + 0x160),(int)*(short *)(in_RDI + 0x162),
          (int)*(short *)(in_RDI + 0x164));
  if (0 < *(long *)(in_RDI + 0x168)) {
    fprintf(in_RSI,"Gold %ld\n",*(undefined8 *)(in_RDI + 0x168));
  }
  if (0 < *(int *)(in_RDI + 0x178)) {
    fprintf(in_RSI,"Exp  %d\n",(ulong)*(uint *)(in_RDI + 0x178));
  }
  if (in_RDI + 0x180 != *(long *)(in_RDI + 0x78) + 0x78) {
    pcVar2 = print_flags(in_stack_ffffffffffffffd0);
    fprintf(in_RSI,"Act  %s\n",pcVar2);
  }
  if (in_RDI + 0x1e8 != *(long *)(in_RDI + 0x78) + 0x88) {
    pcVar2 = print_flags(in_stack_ffffffffffffffd0);
    fprintf(in_RSI,"AfBy %s\n",pcVar2);
  }
  if (in_RDI != -400) {
    __stream = in_RSI;
    pcVar2 = print_flags((long *)in_RSI);
    fprintf(__stream,"Comm %s\n",pcVar2);
  }
  *(undefined2 *)(in_RDI + 0x1f8) = 8;
  fprintf(in_RSI,"Pos  %d\n",8);
  if (*(short *)(in_RDI + 0x202) != 0) {
    fprintf(in_RSI,"Save %d\n",(ulong)(uint)(int)*(short *)(in_RDI + 0x202));
  }
  if (*(short *)(in_RDI + 0x204) != *(short *)(*(long *)(in_RDI + 0x78) + 0x98)) {
    fprintf(in_RSI,"Alig %d\n",(ulong)(uint)(int)*(short *)(in_RDI + 0x204));
  }
  if (*(short *)(in_RDI + 0x206) != *(short *)(*(long *)(in_RDI + 0x78) + 0x9c)) {
    fprintf(in_RSI,"Hit  %d\n",(ulong)(uint)(int)*(short *)(in_RDI + 0x206));
  }
  if (*(short *)(in_RDI + 0x208) != *(short *)(*(long *)(in_RDI + 0x78) + 0xae)) {
    fprintf(in_RSI,"Dam  %d\n",(ulong)(uint)(int)*(short *)(in_RDI + 0x208));
  }
  fprintf(in_RSI,"ACs  %d %d %d %d\n",(ulong)(uint)(int)*(short *)(in_RDI + 0x20a),
          (ulong)(uint)(int)*(short *)(in_RDI + 0x20c),(ulong)(uint)(int)*(short *)(in_RDI + 0x20e),
          (ulong)(uint)(int)*(short *)(in_RDI + 0x210));
  fprintf(in_RSI,"Attr %d %d %d %d %d\n",(ulong)(uint)(int)*(short *)(in_RDI + 0x268),
          (ulong)(uint)(int)*(short *)(in_RDI + 0x26a),(ulong)(uint)(int)*(short *)(in_RDI + 0x26c),
          (ulong)(uint)(int)*(short *)(in_RDI + 0x26e),(int)*(short *)(in_RDI + 0x270));
  fprintf(in_RSI,"AMod %d %d %d %d %d\n",(ulong)(uint)(int)*(short *)(in_RDI + 0x272),
          (ulong)(uint)(int)*(short *)(in_RDI + 0x274),(ulong)(uint)(int)*(short *)(in_RDI + 0x276),
          (ulong)(uint)(int)*(short *)(in_RDI + 0x278),(int)*(short *)(in_RDI + 0x27a));
  fprintf(in_RSI,"End\n");
  return;
}

Assistant:

void fwrite_pet(CHAR_DATA *pet, FILE *fp)
{
	fprintf(fp, "#PET\n");
	fprintf(fp, "Vnum %d\n", pet->pIndexData->vnum);
	fprintf(fp, "Name %s~\n", pet->name);
	fprintf(fp, "LogO %ld\n", current_time);

	if (pet->short_descr != pet->pIndexData->short_descr)
		fprintf(fp, "ShD  %s~\n", pet->short_descr);

	if (pet->long_descr != pet->pIndexData->long_descr)
		fprintf(fp, "LnD  %s~\n", pet->long_descr);

	if (pet->description != pet->pIndexData->description)
		fprintf(fp, "Desc %s~\n", pet->description);

	if (pet->race != pet->pIndexData->race)
		fprintf(fp, "Race %s~\n", race_data_lookup(pet->race)->name);

	if (pet->cabal)
		fprintf(fp, "Cabal %s~\n", cabal_table[pet->cabal].name);

	fprintf(fp, "Sex  %d\n", pet->sex);

	if (pet->level != pet->pIndexData->level)
		fprintf(fp, "Levl %d\n", pet->level);

	fprintf(fp, "HMV  %d %d %d %d %d %d\n", pet->hit, pet->max_hit, pet->mana, pet->max_mana, pet->move, pet->max_move);

	if (pet->gold > 0)
		fprintf(fp, "Gold %ld\n", pet->gold);

	if (pet->exp > 0)
		fprintf(fp, "Exp  %d\n", pet->exp);

	if (pet->act != pet->pIndexData->act)
		fprintf(fp, "Act  %s\n", print_flags(pet->act));

	if (pet->affected_by != pet->pIndexData->affected_by)
		fprintf(fp, "AfBy %s\n", print_flags(pet->affected_by));

	if (pet->comm != 0)
		fprintf(fp, "Comm %s\n", print_flags(pet->comm));

	fprintf(fp, "Pos  %d\n", pet->position = POS_FIGHTING ? POS_STANDING : pet->position);

	if (pet->saving_throw != 0)
		fprintf(fp, "Save %d\n", pet->saving_throw);

	if (pet->alignment != pet->pIndexData->alignment)
		fprintf(fp, "Alig %d\n", pet->alignment);

	if (pet->hitroll != pet->pIndexData->hitroll)
		fprintf(fp, "Hit  %d\n", pet->hitroll);

	if (pet->damroll != pet->pIndexData->damage[DICE_BONUS])
		fprintf(fp, "Dam  %d\n", pet->damroll);

	fprintf(fp, "ACs  %d %d %d %d\n", pet->armor[0], pet->armor[1], pet->armor[2], pet->armor[3]);
	fprintf(fp, "Attr %d %d %d %d %d\n",
		pet->perm_stat[STAT_STR],
		pet->perm_stat[STAT_INT],
		pet->perm_stat[STAT_WIS],
		pet->perm_stat[STAT_DEX],
		pet->perm_stat[STAT_CON]);
	fprintf(fp, "AMod %d %d %d %d %d\n",
		pet->mod_stat[STAT_STR],
		pet->mod_stat[STAT_INT],
		pet->mod_stat[STAT_WIS],
		pet->mod_stat[STAT_DEX],
		pet->mod_stat[STAT_CON]);
	/*
	for ( paf = pet->affected; paf != nullptr; paf = paf->next )
	{
		if (paf->type < 0 || paf->type >= MAX_SKILL)
			continue;

		paf->aftype = isAftSpell(paf->aftype);

		fprintf(fp, "Affc '%s' %3d %3d %3d %3d %3d %s %3d %s '%s'\n",
			skill_table[paf->type].name,
			paf->where,
			paf->level,
			paf->duration,
			paf->modifier,
			paf->location,
			print_flags(paf->bitvector),
			paf->aftype,
			paf->owner ? paf->owner->name : "none",
			paf->name ? paf->name : "none");
	}
	 THIS IS VARY VARY BAD.
	*/

	fprintf(fp, "End\n");
}